

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-gpio.c
# Opt level: O2

int list_platform_pins(uint8_t platform_offset)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *__s1;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = mraa_get_platform_pin_count();
  uVar2 = uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = 0;
  }
  for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
    uVar3 = uVar5;
    if (platform_offset != '\0') {
      uVar3 = mraa_get_sub_platform_id(uVar5);
    }
    uVar6 = (ulong)uVar3;
    __s1 = (char *)mraa_get_pin_name(uVar6);
    iVar4 = strcmp(__s1,"INVALID");
    if (iVar4 != 0) {
      iVar4 = mraa_pin_mode_test(uVar6,0);
      if (iVar4 != 0) {
        fprintf(_stdout,"%02d ",uVar6);
        fprintf(_stdout,"%*s: ",0xb,__s1);
        iVar4 = mraa_pin_mode_test(uVar6,1);
        if (iVar4 != 0) {
          fwrite("GPIO ",5,1,_stdout);
        }
        iVar4 = mraa_pin_mode_test(uVar6,5);
        if (iVar4 != 0) {
          fwrite("I2C  ",5,1,_stdout);
        }
        iVar4 = mraa_pin_mode_test(uVar6,4);
        if (iVar4 != 0) {
          fwrite("SPI  ",5,1,_stdout);
        }
        iVar4 = mraa_pin_mode_test(uVar6,2);
        if (iVar4 != 0) {
          fwrite("PWM  ",5,1,_stdout);
        }
        iVar4 = mraa_pin_mode_test(uVar6,6);
        if (iVar4 != 0) {
          fwrite("AIO  ",5,1,_stdout);
        }
        iVar4 = mraa_pin_mode_test(uVar6,7);
        if (iVar4 != 0) {
          fwrite("UART ",5,1,_stdout);
        }
        fputc(10,_stdout);
      }
    }
  }
  return uVar1;
}

Assistant:

int
list_platform_pins(uint8_t platform_offset)
{
    int pin_count = mraa_get_platform_pin_count(platform_offset);
    int i;
    for (i = 0; i < pin_count; ++i) {
        int pin_id = platform_offset > 0 ? mraa_get_sub_platform_id(i) : i;
        char* pin_name = mraa_get_pin_name(pin_id);
        if (strcmp(pin_name, "INVALID")  != 0 && mraa_pin_mode_test(pin_id, MRAA_PIN_VALID)) {
            fprintf(stdout, "%02d ", pin_id);
            fprintf(stdout, "%*s: ", (MRAA_PIN_NAME_SIZE - 1), pin_name);
            if (mraa_pin_mode_test(pin_id, MRAA_PIN_GPIO))
                fprintf(stdout, "GPIO ");
            if (mraa_pin_mode_test(pin_id, MRAA_PIN_I2C))
                fprintf(stdout, "I2C  ");
            if (mraa_pin_mode_test(pin_id, MRAA_PIN_SPI))
                fprintf(stdout, "SPI  ");
            if (mraa_pin_mode_test(pin_id, MRAA_PIN_PWM))
                fprintf(stdout, "PWM  ");
            if (mraa_pin_mode_test(pin_id, MRAA_PIN_AIO))
                fprintf(stdout, "AIO  ");
            if (mraa_pin_mode_test(pin_id, MRAA_PIN_UART))
                fprintf(stdout, "UART ");
            fprintf(stdout, "\n");
        }
    }
    return pin_count;    
}